

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTriangleLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  LightNodeImpl<embree::SceneGraph::TriangleLight> *this_00;
  undefined8 *in_RDX;
  XMLLoader *this_01;
  string *childID;
  Vec3fa VVar1;
  Vec3fa L;
  AffineSpace3fa space;
  allocator local_f1;
  undefined1 local_f0 [8];
  undefined1 local_e8 [36];
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  undefined1 auStack_b0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  SharedState *local_98;
  _Base_ptr p_Stack_90;
  _Base_ptr local_88;
  _Base_ptr p_Stack_80;
  _Base_ptr local_78;
  _Base_ptr p_Stack_70;
  XML *local_68;
  pointer pRStack_60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  this_01 = (XMLLoader *)*in_RDX;
  std::__cxx11::string::string((string *)(auStack_b0 + 8),"AffineSpace",(allocator *)local_f0);
  XML::child((XML *)local_e8,(string *)this_01);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)&local_58.field_1,this_01,(Ref<embree::XML> *)local_e8);
  if ((XML *)local_e8._0_8_ != (XML *)0x0) {
    (*(code *)((*(XML **)local_e8._0_8_)->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)();
  }
  std::__cxx11::string::~string((string *)(auStack_b0 + 8));
  childID = (string *)*in_RDX;
  std::__cxx11::string::string((string *)(auStack_b0 + 8),"L",&local_f1);
  XML::child((XML *)local_f0,childID);
  VVar1 = load<embree::Vec3fa>((XMLLoader *)local_e8,(Ref<embree::XML> *)childID);
  if (local_f0 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_f0 + 0x18))(VVar1.field_0._0_4_,VVar1.field_0._8_8_);
  }
  std::__cxx11::string::~string((string *)(auStack_b0 + 8));
  local_28 = local_38 * 0.0 + local_28;
  fStack_24 = fStack_34 * 0.0 + fStack_24;
  fStack_20 = fStack_30 * 0.0 + fStack_20;
  fStack_1c = fStack_2c * 0.0 + fStack_1c;
  local_e8._16_4_ = local_48 * 0.0 + local_28;
  local_e8._20_4_ = fStack_44 * 0.0 + fStack_24;
  local_e8._24_4_ = fStack_40 * 0.0 + fStack_20;
  local_e8._28_4_ = fStack_3c * 0.0 + fStack_1c;
  local_b8 = local_58.m128[0] + (float)local_e8._16_4_;
  fStack_b4 = local_58.m128[1] + (float)local_e8._20_4_;
  auStack_b0._0_4_ = local_58.m128[2] + (float)local_e8._24_4_;
  auStack_b0._4_4_ = local_58.m128[3] + (float)local_e8._28_4_;
  local_e8._32_4_ = local_28 + local_48 + local_58.m128[0] * 0.0;
  fStack_c4 = fStack_24 + fStack_44 + local_58.m128[1] * 0.0;
  fStack_c0 = fStack_20 + fStack_40 + local_58.m128[2] * 0.0;
  fStack_bc = fStack_1c + fStack_3c + local_58.m128[3] * 0.0;
  local_e8._16_4_ = local_58.m128[0] * 0.0 + (float)local_e8._16_4_;
  local_e8._20_4_ = local_58.m128[1] * 0.0 + (float)local_e8._20_4_;
  local_e8._24_4_ = local_58.m128[2] * 0.0 + (float)local_e8._24_4_;
  local_e8._28_4_ = local_58.m128[3] * 0.0 + (float)local_e8._28_4_;
  this_00 = (LightNodeImpl<embree::SceneGraph::TriangleLight> *)
            SceneGraph::LightNodeImpl<embree::SceneGraph::TriangleLight>::operator_new(0xc0);
  local_a8._M_allocated_capacity._0_4_ = 5;
  local_98 = (SharedState *)CONCAT44(fStack_b4,local_b8);
  p_Stack_90 = (_Base_ptr)CONCAT44(auStack_b0._4_4_,auStack_b0._0_4_);
  local_88 = (_Base_ptr)CONCAT44(fStack_c4,local_e8._32_4_);
  p_Stack_80 = (_Base_ptr)CONCAT44(fStack_bc,fStack_c0);
  local_78 = (_Base_ptr)CONCAT44(local_e8._20_4_,local_e8._16_4_);
  p_Stack_70 = (_Base_ptr)CONCAT44(local_e8._28_4_,local_e8._24_4_);
  local_68 = (XML *)local_e8._0_8_;
  pRStack_60 = (pointer)local_e8._8_8_;
  SceneGraph::LightNodeImpl<embree::SceneGraph::TriangleLight>::LightNodeImpl
            (this_00,(TriangleLight *)(auStack_b0 + 8));
  (this->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)(*(long *)&(this_00->super_LightNode).super_Node.super_RefCount + 0x10))(this_00);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTriangleLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    const Vec3fa v0 = xfmPoint(space, Vec3fa(1, 0, 0));
    const Vec3fa v1 = xfmPoint(space, Vec3fa(0, 1, 0));
    const Vec3fa v2 = xfmPoint(space, Vec3fa(0, 0, 0));
    return new SceneGraph::LightNodeImpl<SceneGraph::TriangleLight>(SceneGraph::TriangleLight(v0,v1,v2,L));
  }